

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.h
# Opt level: O2

bool absl::lts_20240722::numbers_internal::safe_strtoi_base<int>
               (string_view s,Nonnull<int_*> out,int base)

{
  bool bVar1;
  undefined7 in_register_00000001;
  undefined4 in_register_0000000c;
  int32_t val;
  int local_14;
  
  local_14 = (int)((uint7)in_register_00000001 >> 0x18);
  bVar1 = (bool)absl::lts_20240722::numbers_internal::safe_strto32_base
                          (s._M_len,s._M_str,&local_14,CONCAT44(in_register_0000000c,base));
  *out = local_14;
  return bVar1;
}

Assistant:

ABSL_MUST_USE_RESULT bool safe_strtoi_base(absl::string_view s,
                                           absl::Nonnull<int_type*> out,
                                           int base) {
  static_assert(sizeof(*out) == 4 || sizeof(*out) == 8,
                "SimpleAtoi works only with 32-bit or 64-bit integers.");
  static_assert(!std::is_floating_point<int_type>::value,
                "Use SimpleAtof or SimpleAtod instead.");
  bool parsed;
  // TODO(jorg): This signed-ness check is used because it works correctly
  // with enums, and it also serves to check that int_type is not a pointer.
  // If one day something like std::is_signed<enum E> works, switch to it.
  // These conditions are constexpr bools to suppress MSVC warning C4127.
  constexpr bool kIsSigned = static_cast<int_type>(1) - 2 < 0;
  constexpr bool kUse64Bit = sizeof(*out) == 64 / 8;
  if (kIsSigned) {
    if (kUse64Bit) {
      int64_t val;
      parsed = numbers_internal::safe_strto64_base(s, &val, base);
      *out = static_cast<int_type>(val);
    } else {
      int32_t val;
      parsed = numbers_internal::safe_strto32_base(s, &val, base);
      *out = static_cast<int_type>(val);
    }
  } else {
    if (kUse64Bit) {
      uint64_t val;
      parsed = numbers_internal::safe_strtou64_base(s, &val, base);
      *out = static_cast<int_type>(val);
    } else {
      uint32_t val;
      parsed = numbers_internal::safe_strtou32_base(s, &val, base);
      *out = static_cast<int_type>(val);
    }
  }
  return parsed;
}